

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

void __thiscall
TTD::TextFormatWriter::WriteNakedString(TextFormatWriter *this,TTString *val,Separator separator)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  bVar1 = IsNullPtrTTString(val);
  if (bVar1) {
    (*(this->super_FileWriter)._vptr_FileWriter[10])(this,0);
    return;
  }
  FileWriter::WriteFormattedCharData<7ul,unsigned_int>
            (&this->super_FileWriter,(char16 (*) [7])L"@%I32u",val->Length);
  FileWriter::WriteRawChar(&this->super_FileWriter,L'\"');
  FileWriter::WriteRawCharBuff(&this->super_FileWriter,val->Contents,(ulong)val->Length);
  FileWriter::WriteRawChar(&this->super_FileWriter,L'\"');
  return;
}

Assistant:

void TextFormatWriter::WriteNakedString(const TTString& val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(IsNullPtrTTString(val))
        {
            this->WriteNakedNull();
        }
        else
        {
            this->WriteFormattedCharData(_u("@%I32u"), val.Length);

            this->WriteRawChar(_u('\"'));
            this->WriteRawCharBuff(val.Contents, val.Length);
            this->WriteRawChar(_u('\"'));
        }
    }